

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialogPrivate::updateStyles(QFontDialogPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  QLineEdit *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  QAbstractItemModel *pQVar5;
  QStyle *pQVar6;
  CaseSensitivity CVar7;
  int i;
  int iVar8;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1String *pQStack_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFontListView::currentText((QString *)&local_70,this->familyList);
  QFontDatabase::styles((QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)this->styleList);
  QStringListModel::setStringList((QList_conflict *)pQVar5);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    QLineEdit::clear(this->styleEdit);
    this->smoothScalable = false;
  }
  else {
    lVar1 = (this->style).d.size;
    if (lVar1 == 0) {
      QFontListView::setCurrentItem(this->styleList,0);
    }
    else {
      local_70.d = (this->style).d.d;
      local_70.ptr = (this->style).d.ptr;
      if (local_70.d != (Data *)0x0) {
        LOCK();
        ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar3 = false;
      local_70.size = lVar1;
      while( true ) {
        for (iVar8 = 0; iVar4 = QFontListView::count(this->styleList), iVar8 < iVar4;
            iVar8 = iVar8 + 1) {
          QFontListView::text((QString *)&local_88,this->styleList,iVar8);
          bVar2 = ::comparesEqual((QString *)&local_70,(QString *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          if (bVar2) goto LAB_004b3609;
        }
        iVar8 = 0;
        if (bVar3) break;
        s.m_data = "Italic";
        s.m_size = 6;
        bVar3 = QString::contains((QString *)&local_70,s,CaseSensitive);
        if (bVar3) {
          pQStack_a0 = (QLatin1String *)0x6;
          CVar7 = 0x66bd12;
        }
        else {
          s_00.m_data = "Oblique";
          s_00.m_size = 7;
          bVar3 = QString::contains((QString *)&local_70,s_00,CaseSensitive);
          pQStack_a0 = (QLatin1String *)0x7;
          if (bVar3) {
            CVar7 = 0x66bd19;
          }
          else {
            s_01.m_data = "Regular";
            s_01.m_size = 7;
            bVar3 = QString::contains((QString *)&local_70,s_01,CaseSensitive);
            if (bVar3) {
              pQStack_a0 = (QLatin1String *)0x7;
              CVar7 = 0x66bd21;
            }
            else {
              pQStack_a0 = (QLatin1String *)0x6;
              s_02.m_data = "Normal";
              s_02.m_size = 6;
              bVar3 = QString::contains((QString *)&local_70,s_02,CaseSensitive);
              if (!bVar3) break;
              CVar7 = 0x66bd29;
            }
          }
        }
        QString::replace((QLatin1String *)&local_70,pQStack_a0,CVar7);
        bVar3 = true;
      }
LAB_004b3609:
      QFontListView::setCurrentItem(this->styleList,iVar8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    }
    this_01 = this->styleEdit;
    QFontListView::currentText((QString *)&local_70,this->styleList);
    QLineEdit::setText(this_01,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    pQVar6 = QWidget::style(this_00);
    iVar8 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0xd,0,this_00,0);
    if ((iVar8 != 0) && (bVar3 = QWidget::hasFocus((QWidget *)this->styleList), bVar3)) {
      QLineEdit::selectAll(this->styleEdit);
    }
    QFontListView::currentText((QString *)&local_70,this->familyList);
    QFontListView::currentText((QString *)&local_88,this->styleList);
    bVar3 = (bool)QFontDatabase::isSmoothlyScalable((QString *)&local_70,(QString *)&local_88);
    this->smoothScalable = bVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  updateSizes(this);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontDialogPrivate::updateStyles()
{
    Q_Q(QFontDialog);
    QStringList styles = QFontDatabase::styles(familyList->currentText());
    styleList->model()->setStringList(styles);

    if (styles.isEmpty()) {
        styleEdit->clear();
        smoothScalable = false;
    } else {
        if (!style.isEmpty()) {
            bool found = false;
            bool first = true;
            QString cstyle = style;

        redo:
            for (int i = 0; i < static_cast<int>(styleList->count()); i++) {
                if (cstyle == styleList->text(i)) {
                     styleList->setCurrentItem(i);
                     found = true;
                     break;
                 }
            }
            if (!found && first) {
                if (cstyle.contains("Italic"_L1)) {
                    cstyle.replace("Italic"_L1, "Oblique"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Oblique"_L1)) {
                    cstyle.replace("Oblique"_L1, "Italic"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Regular"_L1)) {
                    cstyle.replace("Regular"_L1, "Normal"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Normal"_L1)) {
                    cstyle.replace("Normal"_L1, "Regular"_L1);
                    first = false;
                    goto redo;
                }
            }
            if (!found)
                styleList->setCurrentItem(0);
        } else {
            styleList->setCurrentItem(0);
        }

        styleEdit->setText(styleList->currentText());
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && styleList->hasFocus())
            styleEdit->selectAll();

        smoothScalable = QFontDatabase::isSmoothlyScalable(familyList->currentText(), styleList->currentText());
    }

    updateSizes();
}